

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O0

void __thiscall
efsw::DirectorySnapshot::deleteAll(DirectorySnapshot *this,DirectorySnapshotDiff *Diff)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_70;
  _Self local_68;
  iterator it;
  FileInfo fi;
  DirectorySnapshotDiff *Diff_local;
  DirectorySnapshot *this_local;
  
  FileInfo::FileInfo((FileInfo *)&it);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
       ::begin(&this->Files);
  while( true ) {
    local_70._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
         ::end(&this->Files);
    bVar1 = std::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
             ::operator->(&local_68);
    FileInfo::operator=((FileInfo *)&it,&ppVar2->second);
    bVar1 = FileInfo::isDirectory((FileInfo *)&it);
    if (bVar1) {
      std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                (&Diff->DirsDeleted,(value_type *)&it);
    }
    else {
      std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                (&Diff->FilesDeleted,(value_type *)&it);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
    ::operator++(&local_68,0);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  ::clear(&this->Files);
  FileInfo::~FileInfo((FileInfo *)&it);
  return;
}

Assistant:

void DirectorySnapshot::deleteAll( DirectorySnapshotDiff& Diff ) {
	FileInfo fi;

	for ( FileInfoMap::iterator it = Files.begin(); it != Files.end(); it++ ) {
		fi = it->second;

		if ( fi.isDirectory() ) {
			Diff.DirsDeleted.push_back( fi );
		} else {
			Diff.FilesDeleted.push_back( fi );
		}
	}

	Files.clear();
}